

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.cpp
# Opt level: O1

int Potassco::xconvert(char *x,string *out,char **errPos,int sep)

{
  char *pcVar1;
  
  if (sep != 0) {
    pcVar1 = strchr(x,(int)(char)sep);
    if (pcVar1 != (char *)0x0) {
      pcVar1 = (char *)out->_M_string_length;
      goto LAB_0011ac30;
    }
  }
  pcVar1 = (char *)out->_M_string_length;
  strlen(x);
LAB_0011ac30:
  std::__cxx11::string::_M_replace((ulong)out,0,pcVar1,(ulong)x);
  if (errPos != (char **)0x0) {
    *errPos = x + out->_M_string_length;
  }
  return 1;
}

Assistant:

int xconvert(const char* x, string& out, const char** errPos, int sep) {
	const char* end;
	if (sep == 0 || (end = strchr(x, char(sep))) == 0) {
		out = x;
	}
	else {
		out.assign(x, end - x);
	}
	if (errPos) { *errPos = x + out.length(); }
	return 1;
}